

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldsTable.cpp
# Opt level: O2

JSONNode __thiscall ser::FieldsTable::TableToJSON(FieldsTable *this)

{
  _Rb_tree_node_base *p_Var1;
  long in_RSI;
  allocator local_49;
  
  ::JSONNode::JSONNode((JSONNode *)this,'\x04');
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,"FieldsTable",&local_49);
  ::JSONNode::set_name((JSONNode *)this,(json_string *)&stack0xffffffffffffffb8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  for (p_Var1 = *(_Rb_tree_node_base **)(in_RSI + 0x18);
      p_Var1 != (_Rb_tree_node_base *)(in_RSI + 8);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    DataFieldInfo::ToJSON((DataFieldInfo *)&stack0xffffffffffffffb8,(int)p_Var1 + 0x40);
    ::JSONNode::push_back((JSONNode *)this,(JSONNode *)&stack0xffffffffffffffb8);
    ::JSONNode::~JSONNode((JSONNode *)&stack0xffffffffffffffb8);
  }
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

JSONNode FieldsTable::TableToJSON() const
{
    int id = 0;
    JSONNode node(JSON_ARRAY);
    node.set_name("FieldsTable");
    for (std::map<std::string, DataFieldInfo>::const_iterator iter = data_.begin(); iter != data_.end(); ++iter)
    {
        node.push_back(iter->second.ToJSON(id++));
    }
    return node;
}